

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_match.cpp
# Opt level: O1

string * check_type(string *__return_storage_ptr__,string *opt)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var1;
  ostream *poVar2;
  ValidationError *this;
  ostringstream msg;
  string local_1b0;
  ostringstream local_190 [376];
  
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (CSD_TYPES_abi_cxx11_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     CSD_TYPES_abi_cxx11_.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,opt);
  if (_Var1._M_current !=
      CSD_TYPES_abi_cxx11_.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    return __return_storage_ptr__;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_190,(opt->_M_dataplus)._M_p,opt->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," is not a valid type.",0x15);
  this = (ValidationError *)__cxa_allocate_exception(0x38);
  std::__cxx11::stringbuf::str();
  CLI::ValidationError::ValidationError(this,&local_1b0);
  __cxa_throw(this,&CLI::ValidationError::typeinfo,CLI::Error::~Error);
}

Assistant:

std::string
check_type(const std::string& opt)
{
    if (std::find(CSD_TYPES.begin(), CSD_TYPES.end(), opt) == CSD_TYPES.end()) {
        std::ostringstream msg{};
        msg << opt << " is not a valid type.";
        throw CLI::ValidationError(msg.str());
    }

    return std::string();
}